

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::GPUShaderFP64Test10::prepareArgument
          (GPUShaderFP64Test10 *this,functionObject *function_object,GLuint vertex,GLubyte *buffer)

{
  GLuint GVar1;
  GLuint GVar2;
  GPUShaderFP64Test10 *this_00;
  GLuint argument;
  GLuint argument_00;
  
  GVar1 = (*function_object->_vptr_functionObject[3])(function_object);
  for (argument_00 = 0; GVar1 != argument_00; argument_00 = argument_00 + 1) {
    this_00 = (GPUShaderFP64Test10 *)function_object;
    GVar2 = functionObject::getArgumentOffset(function_object,argument_00);
    prepareComponents(this_00,function_object,vertex,argument_00,buffer + GVar2);
  }
  return;
}

Assistant:

void GPUShaderFP64Test10::prepareArgument(const functionObject& function_object, glw::GLuint vertex,
										  glw::GLubyte* buffer)
{
	const glw::GLuint n_arguments = function_object.getArgumentCount();

	for (glw::GLuint argument = 0; argument < n_arguments; ++argument)
	{
		const glw::GLuint offset = function_object.getArgumentOffset(argument);

		prepareComponents(function_object, vertex, argument, buffer + offset);
	}
}